

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

char * bc_shell_quote(char *command)

{
  char c;
  bc_string_t *pbVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  
  pbVar1 = (bc_string_t *)bc_malloc(0x18);
  pbVar1->str = (char *)0x0;
  pbVar1->len = 0;
  pbVar1->allocated_len = 0;
  pbVar1 = bc_string_append_len(pbVar1,"",0);
  bc_string_append_c(pbVar1,'\'');
  if ((command != (char *)0x0) && (*command != '\0')) {
    uVar4 = 0;
    do {
      c = command[uVar4];
      if (c == '\'') {
        pcVar3 = "\'\\\'\'";
LAB_0010a291:
        bc_string_append(pbVar1,pcVar3);
      }
      else {
        if (c == '!') {
          pcVar3 = "\'\\!\'";
          goto LAB_0010a291;
        }
        bc_string_append_c(pbVar1,c);
      }
      uVar4 = uVar4 + 1;
      sVar2 = strlen(command);
    } while (uVar4 < sVar2);
  }
  bc_string_append_c(pbVar1,'\'');
  if (pbVar1 == (bc_string_t *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = pbVar1->str;
    free(pbVar1);
  }
  return pcVar3;
}

Assistant:

char*
bc_shell_quote(const char *command)
{
    bc_string_t *rv = bc_string_new();
    bc_string_append_c(rv, '\'');
    if (command != NULL) {
        for (size_t i = 0; i < strlen(command); i++) {
            switch (command[i]) {
                case '!':
                    bc_string_append(rv, "'\\!'");
                    break;
                case '\'':
                    bc_string_append(rv, "'\\''");
                    break;
                default:
                    bc_string_append_c(rv, command[i]);
            }
        }
    }
    bc_string_append_c(rv, '\'');
    return bc_string_free(rv, false);
}